

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBZR.cxx
# Opt level: O3

bool __thiscall cmCTestBZR::RevnoParser::ProcessLine(RevnoParser *this)

{
  char *pcVar1;
  bool bVar2;
  undefined1 *local_28;
  undefined8 local_20;
  undefined1 local_18;
  undefined7 uStack_17;
  
  bVar2 = cmsys::RegularExpression::find
                    (&this->RegexRevno,(this->super_LineParser).Line._M_dataplus._M_p);
  if (bVar2) {
    pcVar1 = (this->RegexRevno).startp[1];
    if (pcVar1 == (char *)0x0) {
      local_28 = &local_18;
      local_20 = 0;
      local_18 = 0;
    }
    else {
      local_28 = &local_18;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_28,pcVar1,(this->RegexRevno).endp[1]);
    }
    std::__cxx11::string::operator=((string *)this->Rev,(string *)&local_28);
    if (local_28 != &local_18) {
      operator_delete(local_28,CONCAT71(uStack_17,local_18) + 1);
    }
  }
  return true;
}

Assistant:

virtual bool ProcessLine()
    {
    if(this->RegexRevno.find(this->Line))
      {
      this->Rev = this->RegexRevno.match(1);
      }
    return true;
    }